

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8 __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (ExceptionTranslatorRegistry *this)

{
  undefined8 in_RDI;
  TestFailureException *anon_var_0;
  exception *ex;
  string *msg;
  char *msg_1;
  ExceptionTranslatorRegistry *in_stack_ffffffffffffff98;
  
  tryTranslators_abi_cxx11_(in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    return tryTranslators();
                }
                @catch (NSException *exception) {
                    return Catch::toString( [exception description] );
                }
#else
                return tryTranslators();
#endif
            }
            catch( TestFailureException& ) {
                throw;
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return "Unknown exception";
            }
        }